

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::state_changed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,state_changed_alert *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&bStack_58,&local_38,": state changed to: ");
  std::operator+(__return_storage_ptr__,&bStack_58,
                 _ZZNK10libtorrent19state_changed_alert7messageB5cxx11EvE9state_str_rel +
                 *(int *)(_ZZNK10libtorrent19state_changed_alert7messageB5cxx11EvE9state_str_rel +
                         (ulong)this->state * 4));
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string state_changed_alert::message() const
	{
		static char const* const state_str[] =
			{"checking (q)", "checking", "dl metadata"
			, "downloading", "finished", "seeding", "allocating"
			, "checking (r)"};

		return torrent_alert::message() + ": state changed to: "
			+ state_str[state];
	}